

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O2

v128 compute_directions(v128 *lines,int32_t *tmp_cost1)

{
  v128 alVar1;
  v128 alVar2;
  v128 alVar3;
  longlong in_RAX;
  longlong in_RDX;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  v128 tmp_1;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  v128 tmp;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  v128 alVar18;
  
  alVar18 = *lines;
  alVar1 = lines[1];
  alVar2 = lines[2];
  alVar3 = lines[3];
  auVar6 = vpslldq_avx((undefined1  [16])alVar18,0xe);
  auVar7 = vpsrldq_avx((undefined1  [16])alVar18,2);
  auVar8 = vpslldq_avx((undefined1  [16])alVar1,0xc);
  auVar6 = vpaddw_avx(auVar8,auVar6);
  auVar8 = vpsrldq_avx((undefined1  [16])alVar1,4);
  auVar7 = vpaddw_avx(auVar8,auVar7);
  auVar8 = vpaddw_avx((undefined1  [16])alVar1,(undefined1  [16])alVar18);
  auVar4 = vpslldq_avx((undefined1  [16])alVar2,10);
  auVar9 = vpsrldq_avx((undefined1  [16])alVar2,6);
  auVar11 = vpslldq_avx((undefined1  [16])alVar3,8);
  auVar4 = vpaddw_avx(auVar4,auVar11);
  auVar6 = vpaddw_avx(auVar6,auVar4);
  auVar4 = vpsrldq_avx((undefined1  [16])alVar3,8);
  auVar4 = vpaddw_avx(auVar9,auVar4);
  auVar7 = vpaddw_avx(auVar7,auVar4);
  auVar4 = vpaddw_avx((undefined1  [16])alVar3,(undefined1  [16])alVar2);
  auVar9 = vpslldq_avx(auVar8,10);
  auVar11 = vpslldq_avx(auVar4,8);
  auVar9 = vpaddw_avx(auVar11,auVar9);
  auVar11 = vpslldq_avx(auVar8,4);
  auVar5 = vpslldq_avx(auVar4,6);
  auVar11 = vpaddw_avx(auVar5,auVar11);
  auVar5 = vpaddw_avx(auVar4,auVar8);
  alVar18 = lines[4];
  auVar10 = vpslldq_avx((undefined1  [16])alVar18,6);
  auVar12 = vpsrldq_avx((undefined1  [16])alVar18,10);
  alVar1 = lines[5];
  auVar14 = vpslldq_avx((undefined1  [16])alVar1,4);
  auVar10 = vpaddw_avx(auVar14,auVar10);
  auVar14 = vpsrldq_avx((undefined1  [16])alVar1,0xc);
  auVar12 = vpaddw_avx(auVar12,auVar14);
  auVar14 = vpaddw_avx((undefined1  [16])alVar1,(undefined1  [16])alVar18);
  auVar13 = vpslldq_avx(auVar14,6);
  auVar15 = vpslldq_avx(auVar14,8);
  alVar18 = lines[6];
  auVar16 = vpslldq_avx((undefined1  [16])alVar18,2);
  auVar17 = vpsrldq_avx((undefined1  [16])alVar18,0xe);
  auVar12 = vpaddw_avx(auVar12,auVar17);
  auVar7 = vpaddw_avx(auVar12,auVar7);
  auVar10 = vpaddw_avx(auVar10,(undefined1  [16])lines[7]);
  auVar6 = vpaddw_avx(auVar6,auVar10);
  auVar6 = vpaddw_avx(auVar16,auVar6);
  auVar10 = vpaddw_avx((undefined1  [16])alVar18,(undefined1  [16])lines[7]);
  auVar12 = vpslldq_avx(auVar10,4);
  auVar12 = vpaddw_avx(auVar13,auVar12);
  auVar9 = vpaddw_avx(auVar9,auVar12);
  auVar12 = vpslldq_avx(auVar10,10);
  auVar12 = vpaddw_avx(auVar15,auVar12);
  auVar11 = vpaddw_avx(auVar11,auVar12);
  auVar12 = vpaddw_avx(auVar14,auVar10);
  auVar5 = vpaddw_avx(auVar5,auVar12);
  auVar7 = vpshufb_avx(auVar7,_DAT_004c2ac0);
  auVar12 = vpunpcklwd_avx(auVar6,auVar7);
  auVar7 = vpunpckhwd_avx(auVar6,auVar7);
  auVar6 = vpmaddwd_avx(auVar12,auVar12);
  auVar7 = vpmaddwd_avx(auVar7,auVar7);
  auVar6 = vpmulld_avx(auVar6,_DAT_004c2ad0);
  auVar7 = vpmulld_avx(auVar7,_DAT_004c2ae0);
  auVar12 = vpaddd_avx(auVar6,auVar7);
  auVar6 = vpblendd_avx2((undefined1  [16])0x0,auVar8,8);
  auVar7 = vpshufhw_avx(auVar6,0x6c);
  auVar6 = vpblendw_avx((undefined1  [16])0x0,auVar4,0xe0);
  auVar6 = vpshufhw_avx(auVar6,0x1b);
  auVar6 = vpaddw_avx(auVar6,auVar7);
  auVar7 = vpshufb_avx(auVar14,_DAT_004c2af0);
  auVar13 = vpshufb_avx(auVar10,_DAT_004c2b00);
  auVar7 = vpaddw_avx(auVar7,auVar13);
  auVar6 = vpaddw_avx(auVar6,auVar7);
  auVar13 = vpunpcklwd_avx(auVar11,auVar6);
  auVar7 = vpunpckhwd_avx(auVar11,auVar6);
  auVar6 = vpmaddwd_avx(auVar13,auVar13);
  auVar7 = vpmaddwd_avx(auVar7,auVar7);
  auVar11 = vpmovsxwd_avx(ZEXT816(0xd201a400000000));
  auVar6 = vpmulld_avx(auVar6,auVar11);
  auVar13 = vpmovzxbd_avx(ZEXT416(0x6969698c));
  auVar7 = vpmulld_avx(auVar7,auVar13);
  auVar7 = vpaddd_avx(auVar7,auVar6);
  auVar6 = vpshufb_avx(auVar8,_DAT_004c2b00);
  auVar8 = vpshufb_avx(auVar4,_DAT_004c2af0);
  auVar6 = vpaddw_avx(auVar8,auVar6);
  auVar8 = vpblendw_avx((undefined1  [16])0x0,auVar14,0xe0);
  auVar8 = vpshufhw_avx(auVar8,0x1b);
  auVar6 = vpaddw_avx(auVar6,auVar8);
  auVar8 = vpblendd_avx2((undefined1  [16])0x0,auVar10,8);
  auVar8 = vpshufhw_avx(auVar8,0x6c);
  auVar6 = vpaddw_avx(auVar6,auVar8);
  auVar4 = vpunpcklwd_avx(auVar9,auVar6);
  auVar8 = vpunpckhwd_avx(auVar9,auVar6);
  auVar6 = vpmaddwd_avx(auVar4,auVar4);
  auVar8 = vpmaddwd_avx(auVar8,auVar8);
  auVar6 = vpmulld_avx(auVar6,auVar11);
  auVar8 = vpmulld_avx(auVar8,auVar13);
  auVar6 = vpaddd_avx(auVar8,auVar6);
  auVar8 = vpmaddwd_avx(auVar5,auVar5);
  auVar4._8_4_ = 0x69;
  auVar4._0_8_ = 0x6900000069;
  auVar4._12_4_ = 0x69;
  auVar8 = vpmulld_avx(auVar8,auVar4);
  auVar9 = vpunpckldq_avx(auVar12,auVar6);
  auVar11 = vpunpckldq_avx(auVar8,auVar7);
  auVar4 = vpunpckhdq_avx(auVar12,auVar6);
  auVar7 = vpunpckhdq_avx(auVar8,auVar7);
  auVar8 = vpunpcklqdq_avx(auVar9,auVar11);
  auVar6 = vpunpckhqdq_avx(auVar9,auVar11);
  auVar6 = vpaddd_avx(auVar8,auVar6);
  auVar8 = vpunpcklqdq_avx(auVar4,auVar7);
  auVar7 = vpunpckhqdq_avx(auVar4,auVar7);
  auVar7 = vpaddd_avx(auVar7,auVar8);
  auVar6 = vpaddd_avx(auVar6,auVar7);
  *(undefined1 (*) [16])tmp_cost1 = auVar6;
  alVar18[1] = in_RDX;
  alVar18[0] = in_RAX;
  return alVar18;
}

Assistant:

static inline v128 compute_directions(v128 lines[8], int32_t tmp_cost1[4]) {
  v128 partial4a, partial4b, partial5a, partial5b, partial7a, partial7b;
  v128 partial6;
  v128 tmp;
  /* Partial sums for lines 0 and 1. */
  partial4a = v128_shl_n_byte(lines[0], 14);
  partial4b = v128_shr_n_byte(lines[0], 2);
  partial4a = v128_add_16(partial4a, v128_shl_n_byte(lines[1], 12));
  partial4b = v128_add_16(partial4b, v128_shr_n_byte(lines[1], 4));
  tmp = v128_add_16(lines[0], lines[1]);
  partial5a = v128_shl_n_byte(tmp, 10);
  partial5b = v128_shr_n_byte(tmp, 6);
  partial7a = v128_shl_n_byte(tmp, 4);
  partial7b = v128_shr_n_byte(tmp, 12);
  partial6 = tmp;

  /* Partial sums for lines 2 and 3. */
  partial4a = v128_add_16(partial4a, v128_shl_n_byte(lines[2], 10));
  partial4b = v128_add_16(partial4b, v128_shr_n_byte(lines[2], 6));
  partial4a = v128_add_16(partial4a, v128_shl_n_byte(lines[3], 8));
  partial4b = v128_add_16(partial4b, v128_shr_n_byte(lines[3], 8));
  tmp = v128_add_16(lines[2], lines[3]);
  partial5a = v128_add_16(partial5a, v128_shl_n_byte(tmp, 8));
  partial5b = v128_add_16(partial5b, v128_shr_n_byte(tmp, 8));
  partial7a = v128_add_16(partial7a, v128_shl_n_byte(tmp, 6));
  partial7b = v128_add_16(partial7b, v128_shr_n_byte(tmp, 10));
  partial6 = v128_add_16(partial6, tmp);

  /* Partial sums for lines 4 and 5. */
  partial4a = v128_add_16(partial4a, v128_shl_n_byte(lines[4], 6));
  partial4b = v128_add_16(partial4b, v128_shr_n_byte(lines[4], 10));
  partial4a = v128_add_16(partial4a, v128_shl_n_byte(lines[5], 4));
  partial4b = v128_add_16(partial4b, v128_shr_n_byte(lines[5], 12));
  tmp = v128_add_16(lines[4], lines[5]);
  partial5a = v128_add_16(partial5a, v128_shl_n_byte(tmp, 6));
  partial5b = v128_add_16(partial5b, v128_shr_n_byte(tmp, 10));
  partial7a = v128_add_16(partial7a, v128_shl_n_byte(tmp, 8));
  partial7b = v128_add_16(partial7b, v128_shr_n_byte(tmp, 8));
  partial6 = v128_add_16(partial6, tmp);

  /* Partial sums for lines 6 and 7. */
  partial4a = v128_add_16(partial4a, v128_shl_n_byte(lines[6], 2));
  partial4b = v128_add_16(partial4b, v128_shr_n_byte(lines[6], 14));
  partial4a = v128_add_16(partial4a, lines[7]);
  tmp = v128_add_16(lines[6], lines[7]);
  partial5a = v128_add_16(partial5a, v128_shl_n_byte(tmp, 4));
  partial5b = v128_add_16(partial5b, v128_shr_n_byte(tmp, 12));
  partial7a = v128_add_16(partial7a, v128_shl_n_byte(tmp, 10));
  partial7b = v128_add_16(partial7b, v128_shr_n_byte(tmp, 6));
  partial6 = v128_add_16(partial6, tmp);

  /* Compute costs in terms of partial sums. */
  partial4a =
      fold_mul_and_sum(partial4a, partial4b, v128_from_32(210, 280, 420, 840),
                       v128_from_32(105, 120, 140, 168));
  partial7a =
      fold_mul_and_sum(partial7a, partial7b, v128_from_32(210, 420, 0, 0),
                       v128_from_32(105, 105, 105, 140));
  partial5a =
      fold_mul_and_sum(partial5a, partial5b, v128_from_32(210, 420, 0, 0),
                       v128_from_32(105, 105, 105, 140));
  partial6 = v128_madd_s16(partial6, partial6);
  partial6 = v128_mullo_s32(partial6, v128_dup_32(105));

  partial4a = hsum4(partial4a, partial5a, partial6, partial7a);
  v128_store_unaligned(tmp_cost1, partial4a);
  return partial4a;
}